

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_test.cpp
# Opt level: O1

int __thiscall counter::inc(counter *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  guard g;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->lock_;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  iVar3 = this->total + 1;
  this->total = iVar3;
  iVar2 = this->current;
  iVar1 = iVar2 + 1;
  this->current = iVar1;
  if (this->max <= iVar2) {
    this->max = iVar1;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return iVar3;
}

Assistant:

int inc() {
		guard g(lock_);
		int r = ++total;
		current++;
		if(max < current)
			max = current;
		return r;
	}